

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  StkId pTVar2;
  
  if (idx < 0) {
    if ((long)L->top - (long)L->base >> 4 < (long)(ulong)(uint)~idx) {
      __assert_fail("-(idx+1) <= (L->top - L->base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                    ,0xad,"void lua_settop(lua_State *, int)");
    }
    pTVar1 = L->top + (long)idx + 1;
  }
  else {
    if ((long)L->stack_last - (long)L->base >> 4 < (long)(ulong)(uint)idx) {
      __assert_fail("idx <= L->stack_last - L->base",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                    ,0xa7,"void lua_settop(lua_State *, int)");
    }
    pTVar1 = L->base + (uint)idx;
    pTVar2 = L->top;
    while (pTVar2 < pTVar1) {
      L->top = pTVar2 + 1;
      pTVar2->tt = 0;
      pTVar2 = pTVar2 + 1;
    }
  }
  L->top = pTVar1;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - L->base);
    while (L->top < L->base + idx)
      setnilvalue(L->top++);
    L->top = L->base + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - L->base));
    L->top += idx+1;  /* `subtract' index (index is negative) */
  }
  lua_unlock(L);
}